

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gog.cpp
# Opt level: O0

bool gog::anon_unknown_0::process_file_unrar(string *file,extract_options *o,string *password)

{
  bool bVar1;
  int iVar2;
  ulong uVar3;
  pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *ppVar4;
  char *pcVar5;
  reference ppcVar6;
  runtime_error *this;
  size_type in_RSI;
  int ret;
  string dir;
  string pwarg;
  vector<const_char_*,_std::allocator<const_char_*>_> args;
  value_type *in_stack_fffffffffffffdb8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdc0;
  int in_stack_fffffffffffffdc8;
  undefined4 in_stack_fffffffffffffdcc;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_fffffffffffffdd0;
  extract_options *in_stack_fffffffffffffdf8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_168 [32];
  undefined4 local_148;
  int local_144;
  undefined8 local_140;
  undefined8 local_138;
  vector<const_char_*,_std::allocator<const_char_*>_> local_130;
  undefined1 local_110 [16];
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  char *local_e0;
  char *local_d8;
  char *local_d0;
  char *local_c8;
  undefined8 local_c0;
  undefined1 local_b8 [64];
  char *local_78;
  char *local_70;
  char *local_68;
  char *local_60;
  char *local_58;
  char *local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  size_type local_18;
  undefined1 local_1;
  
  __lhs = &local_38;
  local_18 = in_RSI;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)0x141dc1);
  local_40 = "unrar";
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffdc0,
             in_stack_fffffffffffffdb8);
  if ((*(byte *)(local_18 + 8) & 1) == 0) {
    if ((*(byte *)(local_18 + 7) & 1) == 0) {
      if ((*(byte *)(local_18 + 1) & 1) == 0) {
        local_70 = "l";
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffdc0,
                   in_stack_fffffffffffffdb8);
      }
      else {
        local_68 = "lb";
        std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                  ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffdc0,
                   in_stack_fffffffffffffdb8);
      }
    }
    else {
      local_60 = "t";
      std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
                ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffdc0,
                 in_stack_fffffffffffffdb8);
    }
  }
  else {
    local_58 = "x";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffdc0,
               in_stack_fffffffffffffdb8);
  }
  local_78 = "-p-";
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffdc0,
             in_stack_fffffffffffffdb8);
  std::__cxx11::string::string((string *)(local_b8 + 0x20));
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::operator+((char *)__lhs,in_stack_fffffffffffffe00);
    in_stack_fffffffffffffdf8 = (extract_options *)local_b8;
    std::__cxx11::string::operator=((string *)(local_b8 + 0x20),(string *)in_stack_fffffffffffffdf8)
    ;
    std::__cxx11::string::~string((string *)in_stack_fffffffffffffdf8);
    local_c0 = std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffdc0,
               in_stack_fffffffffffffdb8);
  }
  local_c8 = "-idc";
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffdc0,
             in_stack_fffffffffffffdb8);
  bVar1 = progress::is_enabled();
  if (!bVar1) {
    local_d0 = "-idp";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffdc0,
               in_stack_fffffffffffffdb8);
  }
  bVar1 = setup::filename_map::is_lowercase((filename_map *)(local_18 + 0x58));
  if (bVar1) {
    local_d8 = "-cl";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffdc0,
               in_stack_fffffffffffffdb8);
  }
  if ((*(byte *)(local_18 + 6) & 1) == 0) {
    local_e0 = "-idq";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffdc0,
               in_stack_fffffffffffffdb8);
  }
  local_e8 = "-o+";
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffdc0,
             in_stack_fffffffffffffdb8);
  if ((*(byte *)(local_18 + 0xd) & 1) == 0) {
    local_f8 = "-tsm0c0a0";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffdc0,
               in_stack_fffffffffffffdb8);
  }
  else {
    local_f0 = "-tsmca";
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffdc0,
               in_stack_fffffffffffffdb8);
  }
  local_100 = "-y";
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffdc0,
             in_stack_fffffffffffffdb8);
  local_110._8_8_ = "--";
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffdc0,
             in_stack_fffffffffffffdb8);
  local_110._0_8_ = std::__cxx11::string::c_str();
  ppVar4 = (pair<bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_110;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffdc0,
             in_stack_fffffffffffffdb8);
  ppVar4 = std::__niter_base<std::pair<bool,std::__cxx11::string>*>
                     ((void *)(local_18 + 0xd8),ppVar4);
  std::__cxx11::string::string((string *)&local_130,(string *)ppVar4);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    std::__cxx11::string::length();
    pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)&local_130);
    if (*pcVar5 != '/') {
      in_stack_fffffffffffffdd0 = &local_130;
      std::__cxx11::string::length();
      pcVar5 = (char *)std::__cxx11::string::operator[]((ulong)in_stack_fffffffffffffdd0);
      if (*pcVar5 != '\\') {
        std::__cxx11::string::operator+=((string *)&local_130,'/');
      }
    }
    local_138 = std::__cxx11::string::c_str();
    std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
              ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffdc0,
               in_stack_fffffffffffffdb8);
  }
  local_140 = 0;
  std::vector<const_char_*,_std::allocator<const_char_*>_>::push_back
            ((vector<const_char_*,_std::allocator<const_char_*>_> *)in_stack_fffffffffffffdc0,
             in_stack_fffffffffffffdb8);
  std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::front
            ((vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *)
             in_stack_fffffffffffffdc0);
  iVar2 = util::run((char **)CONCAT44(in_stack_fffffffffffffdcc,in_stack_fffffffffffffdc8));
  local_144 = iVar2;
  if ((iVar2 < 0) && ((anonymous_namespace)::quit_requested == 0)) {
    in_stack_fffffffffffffdc0 = &local_38;
    ppcVar6 = std::vector<const_char_*,_std::allocator<const_char_*>_>::operator[]
                        ((vector<const_char_*,_std::allocator<const_char_*>_> *)
                         in_stack_fffffffffffffdc0,0);
    *ppcVar6 = "rar";
    std::vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_>::front
              ((vector<boost::filesystem::path,_std::allocator<boost::filesystem::path>_> *)
               in_stack_fffffffffffffdc0);
    in_stack_fffffffffffffdc8 = util::run((char **)CONCAT44(iVar2,in_stack_fffffffffffffdc8));
    local_144 = in_stack_fffffffffffffdc8;
    if ((in_stack_fffffffffffffdc8 < 0) && ((anonymous_namespace)::quit_requested == 0)) {
      local_1 = 0;
      goto LAB_0014251f;
    }
  }
  if (0 < local_144) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    (anonymous_namespace)::get_verb_abi_cxx11_(in_stack_fffffffffffffdf8);
    std::operator+((char *)CONCAT44(iVar2,in_stack_fffffffffffffdc8),in_stack_fffffffffffffdc0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(iVar2,in_stack_fffffffffffffdc8),(char *)in_stack_fffffffffffffdc0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(iVar2,in_stack_fffffffffffffdc8),in_stack_fffffffffffffdc0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(iVar2,in_stack_fffffffffffffdc8),(char *)in_stack_fffffffffffffdc0);
    std::runtime_error::runtime_error(this,local_168);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_1 = 1;
LAB_0014251f:
  local_148 = 1;
  std::__cxx11::string::~string((string *)&local_130);
  std::__cxx11::string::~string((string *)(local_b8 + 0x20));
  std::vector<const_char_*,_std::allocator<const_char_*>_>::~vector(in_stack_fffffffffffffdd0);
  return (bool)(local_1 & 1);
}

Assistant:

bool process_file_unrar(const std::string & file, const extract_options & o, const std::string & password) {
	
	std::vector<const char *> args;
	args.push_back("unrar");
	
	if(o.extract) {
		args.push_back("x");
	} else if(o.test) {
		args.push_back("t");
	} else if(o.silent) {
		args.push_back("lb");
	} else {
		args.push_back("l");
	}
	
	args.push_back("-p-");
	std::string pwarg;
	if(!password.empty()) {
		pwarg = "-p" + password;
		args.push_back(pwarg.c_str());
	}
	
	args.push_back("-idc"); // Disable copyright header
	
	if(!progress::is_enabled()) {
		args.push_back("-idp"); // Disable progress display
	}
	
	if(o.filenames.is_lowercase()) {
		args.push_back("-cl"); // Connvert filenames to lowercase
	}
	
	if(!o.list) {
		args.push_back("-idq"); // Disable file list
	}
	
	args.push_back("-o+"); // Overwrite existing files
	
	if(o.preserve_file_times) {
		args.push_back("-tsmca"); // Restore file times
	} else {
		args.push_back("-tsm0c0a0"); // Don't restore file times
	}
	
	args.push_back("-y"); // Enable batch mode
	
	args.push_back("--");
	
	args.push_back(file.c_str());
	
	std::string dir = o.output_dir.string();
	if(!dir.empty()) {
		if(dir[dir.length() - 1] != '/' && dir[dir.length() - 1] != '\\') {
			#if defined(_WIN32)
			dir += '\\';
			#else
			dir += '/';
			#endif
		}
		args.push_back(dir.c_str());
	}
	
	args.push_back(NULL);
	
	int ret = util::run(&args.front());
	if(ret < 0 && !quit_requested) {
		args[0] = "rar";
		ret = util::run(&args.front());
		if(ret < 0 && !quit_requested) {
			return false;
		}
	}
	
	if(ret > 0) {
		throw std::runtime_error("Could not " + get_verb(o) + " \"" + file + "\": unrar failed");
	}
	
	return true;
}